

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__load_flip(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  int iVar2;
  stbi__uint32 sVar3;
  uchar *puVar4;
  int *in_RCX;
  stbi__context *in_RDX;
  int *in_RSI;
  int in_R8D;
  stbi_uc temp;
  int z;
  int col;
  int row;
  int depth;
  int h;
  int w;
  uchar *result;
  int local_50;
  int local_48;
  int local_44;
  int local_40;
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_50 = in_R8D;
  puVar4 = stbi__load_main(in_RDX,in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if ((stbi__vertically_flip_on_load != 0) && (puVar4 != (uchar *)0x0)) {
    iVar2 = *in_RSI;
    sVar3 = in_RDX->img_x;
    if (local_50 == 0) {
      local_50 = *in_RCX;
    }
    for (local_40 = 0; local_40 < (int)sVar3 >> 1; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < local_50; local_48 = local_48 + 1) {
          uVar1 = puVar4[(local_40 * iVar2 + local_44) * local_50 + local_48];
          puVar4[(local_40 * iVar2 + local_44) * local_50 + local_48] =
               puVar4[(int)((((sVar3 - local_40) + -1) * iVar2 + local_44) * local_50 + local_48)];
          puVar4[(int)((((sVar3 - local_40) + -1) * iVar2 + local_44) * local_50 + local_48)] =
               uVar1;
        }
      }
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__load_flip(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result = stbi__load_main(s, x, y, comp, req_comp);

   if (stbi__vertically_flip_on_load && result != NULL) {
      int w = *x, h = *y;
      int depth = req_comp ? req_comp : *comp;
      int row,col,z;
      stbi_uc temp;

      // @OPTIMIZE: use a bigger temp buffer and memcpy multiple pixels at once
      for (row = 0; row < (h>>1); row++) {
         for (col = 0; col < w; col++) {
            for (z = 0; z < depth; z++) {
               temp = result[(row * w + col) * depth + z];
               result[(row * w + col) * depth + z] = result[((h - row - 1) * w + col) * depth + z];
               result[((h - row - 1) * w + col) * depth + z] = temp;
            }
         }
      }
   }

   return result;
}